

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  SPIRType *pSVar5;
  runtime_error *prVar6;
  uint32_t uVar7;
  char (*in_R8) [2];
  string *in_R9;
  string *ts_3;
  char **in_stack_fffffffffffffc78;
  char *store_op;
  string bitcast_op;
  uint local_344;
  SPIRAccessChain *local_340;
  string local_338;
  SmallVector<unsigned_int,_8UL> *local_318;
  string template_expr;
  string base;
  SPIRType scalar_type;
  SPIRType target_type;
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(chain->super_IVariant).field_0xc);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  target_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&target_type.array.stack_storage;
  target_type.super_IVariant.self.id = 0;
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.array.buffer_capacity = 8;
  target_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&target_type.array_size_literal.stack_storage;
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  target_type.array_size_literal.buffer_capacity = 8;
  target_type.pointer_depth = 0;
  target_type.pointer = false;
  target_type.forward_pointer = false;
  target_type.storage = StorageClassGeneric;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&target_type.member_types.stack_storage;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  target_type.member_types.buffer_capacity = 8;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&target_type.member_type_index_redirection.stack_storage;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.member_type_index_redirection.buffer_capacity = 8;
  target_type.image.type.id = 0;
  target_type.type_alias.id = 0;
  target_type.parent_type.id = 0;
  target_type.member_name_cache._M_h._M_buckets =
       &target_type.member_name_cache._M_h._M_single_bucket;
  target_type.member_name_cache._M_h._M_bucket_count = 1;
  target_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  target_type.member_name_cache._M_h._M_element_count = 0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  target_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  target_type.super_IVariant._12_4_ = 8;
  target_type.width = 0;
  target_type.vecsize = pSVar5->vecsize;
  target_type.columns = pSVar5->columns;
  if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (*(int *)&(pSVar5->super_IVariant).field_0xc != 0xf) {
      if ((pSVar5->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&scalar_type,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                   ,"");
        ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
        *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar4 = (this->hlsl_options).shader_model;
      base._M_dataplus._M_p = (pointer)&base.field_2;
      pcVar2 = (chain->base)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&base,pcVar2,pcVar2 + (chain->base)._M_string_length);
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar3) {
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
      }
      template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
      template_expr._M_string_length = 0;
      template_expr.field_2._M_local_buf[0] = '\0';
      if (0x3d < uVar4) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&bitcast_op,this,pSVar5,0)
        ;
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)0x3626d6,(char (*) [2])&bitcast_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
            &bitcast_op.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                   (int)bitcast_op._M_dataplus._M_p));
        }
      }
      local_340 = chain;
      if (pSVar5->columns == 1) {
        if (chain->row_major_matrix == false) {
          store_op = (char *)0x0;
          switch(pSVar5->vecsize) {
          case 1:
            store_op = "Store";
            break;
          case 2:
            store_op = "Store2";
            break;
          case 3:
            store_op = "Store3";
            break;
          case 4:
            store_op = "Store4";
            break;
          default:
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&scalar_type,"Unknown vector size.","");
            ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
            *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
            __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          write_access_chain_value_abi_cxx11_
                    ((string *)&scalar_type,this,value,composite_chain,false);
          if (uVar4 < 0x3e) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                      (&bitcast_op,this,&target_type,pSVar5);
            if (bitcast_op._M_string_length != 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_338,(spirv_cross *)&bitcast_op,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37dfb0,(char (*) [2])&scalar_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x36641e,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_338);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != &local_338.field_2) {
                operator_delete(local_338._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
          }
          else {
            store_op = "Store";
          }
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&base,(char (*) [2])0x36612b,&store_op,&template_expr
                     ,(char (*) [2])0x37dfb0,&chain->dynamic_index,&chain->static_index,
                     (char (*) [3])0x37aab7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scalar_type,(char (*) [3])0x365573);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
        }
        else {
          if (0x3d < uVar4) {
            SPIRType::SPIRType(&scalar_type,pSVar5);
            scalar_type.vecsize = 1;
            scalar_type.columns = 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_338,this,&scalar_type,0);
            join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&bitcast_op,(spirv_cross *)0x3626d6,(char (*) [2])&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5
                       ,in_R8);
            ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p);
            }
            scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&scalar_type.member_name_cache._M_h);
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0
            ;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.member_type_index_redirection.stack_storage) {
              free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                scalar_type.member_types.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                &scalar_type.member_types.stack_storage) {
              free(scalar_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)
                scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
                &scalar_type.array_size_literal.stack_storage) {
              free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                scalar_type.array.super_VectorView<unsigned_int>.ptr !=
                &scalar_type.array.stack_storage) {
              free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
          local_318 = composite_chain;
          if (pSVar5->vecsize != 0) {
            psVar1 = &local_340->dynamic_index;
            uVar7 = 0;
            do {
              write_access_chain_value_abi_cxx11_((string *)&scalar_type,this,value,local_318,true);
              if (1 < pSVar5->vecsize) {
                ::std::__cxx11::string::append((char *)&scalar_type);
                CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar7);
                ::std::__cxx11::string::append((char *)&scalar_type);
              }
              CompilerGLSL::remove_duplicate_swizzle
                        (&this->super_CompilerGLSL,(string *)&scalar_type);
              if (uVar4 < 0x3e) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                          (&bitcast_op,this,&target_type,pSVar5);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_338,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x37dfb0,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36641e,(char (*) [2])in_R9);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
              }
              bitcast_op._M_dataplus._M_p._0_4_ =
                   local_340->matrix_stride * uVar7 + local_340->static_index;
              in_R9 = psVar1;
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                         (char (*) [2])0x37dfb0,psVar1,(uint *)&bitcast_op,(char (*) [3])0x37aab7,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalar_type,(char (*) [3])0x365573);
              if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
                operator_delete(scalar_type.super_IVariant._vptr_IVariant);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < pSVar5->vecsize);
          }
        }
      }
      else if (chain->row_major_matrix == false) {
        store_op = (char *)0x0;
        switch(pSVar5->vecsize) {
        case 1:
          store_op = "Store";
          break;
        case 2:
          store_op = "Store2";
          break;
        case 3:
          store_op = "Store3";
          break;
        case 4:
          store_op = "Store4";
          break;
        default:
          local_318 = composite_chain;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&scalar_type,"Unknown vector size.","");
          ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
          *(undefined ***)prVar6 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_318 = composite_chain;
        if (0x3d < uVar4) {
          store_op = "Store";
          SPIRType::SPIRType(&scalar_type,pSVar5);
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_338,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x3626d6,(char (*) [2])&local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        local_344 = 0;
        if (pSVar5->columns != 0) {
          psVar1 = &local_340->dynamic_index;
          do {
            write_access_chain_value_abi_cxx11_(&bitcast_op,this,value,local_318,true);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a571
                       ,(char (*) [2])&local_344,(uint *)0x36a476,(char (*) [2])in_R9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                &bitcast_op.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                       (int)bitcast_op._M_dataplus._M_p));
            }
            if (uVar4 < 0x3e) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                        (&bitcast_op,this,&target_type,pSVar5);
              if (bitcast_op._M_string_length != 0) {
                join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                          (&local_338,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x37dfb0,(char (*) [2])&scalar_type,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x36641e,(char (*) [2])in_R9);
                ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_338);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                  operator_delete(local_338._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
                  &bitcast_op.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                         (int)bitcast_op._M_dataplus._M_p));
              }
            }
            bitcast_op._M_dataplus._M_p._0_4_ =
                 local_340->matrix_stride * local_344 + local_340->static_index;
            in_R9 = (string *)0x37dfb0;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&base,(char (*) [2])0x36612b,&store_op,
                       &template_expr,(char (*) [2])0x37dfb0,psVar1,(uint *)&bitcast_op,
                       (char (*) [3])0x37aab7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scalar_type,(char (*) [3])0x365573);
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
            }
            local_344 = local_344 + 1;
          } while (local_344 < pSVar5->columns);
        }
      }
      else {
        local_318 = composite_chain;
        if (0x3d < uVar4) {
          SPIRType::SPIRType(&scalar_type,pSVar5);
          scalar_type.vecsize = 1;
          scalar_type.columns = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_338,this,&scalar_type,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&bitcast_op,(spirv_cross *)0x3626d6,(char (*) [2])&local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36cdd5,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&bitcast_op);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p) !=
              &bitcast_op.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                     (int)bitcast_op._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p);
          }
          scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&scalar_type.member_name_cache._M_h);
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.member_type_index_redirection.stack_storage) {
            free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              scalar_type.member_types.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
              &scalar_type.member_types.stack_storage) {
            free(scalar_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr
              != &scalar_type.array_size_literal.stack_storage) {
            free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              scalar_type.array.super_VectorView<unsigned_int>.ptr !=
              &scalar_type.array.stack_storage) {
            free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        if (pSVar5->vecsize != 0) {
          psVar1 = &local_340->dynamic_index;
          uVar7 = 0;
          do {
            store_op = (char *)((ulong)store_op & 0xffffffff00000000);
            if (pSVar5->columns != 0) {
              do {
                write_access_chain_value_abi_cxx11_(&bitcast_op,this,value,local_318,true);
                local_338._M_dataplus._M_p =
                     CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar7);
                ts_3 = &local_338;
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                          ((string *)&scalar_type,(spirv_cross *)&bitcast_op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x36a571,(char (*) [2])&store_op,(uint *)0x36688b,
                           (char (*) [3])&local_338,in_stack_fffffffffffffc78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                CompilerGLSL::remove_duplicate_swizzle
                          (&this->super_CompilerGLSL,(string *)&scalar_type);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                          (&bitcast_op,this,&target_type,pSVar5);
                if (bitcast_op._M_string_length != 0) {
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&local_338,(spirv_cross *)&bitcast_op,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x37dfb0,(char (*) [2])&scalar_type,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36641e,(char (*) [2])ts_3);
                  ::std::__cxx11::string::operator=((string *)&scalar_type,(string *)&local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p);
                  }
                }
                local_338._M_dataplus._M_p._0_4_ =
                     local_340->matrix_stride * uVar7 +
                     (pSVar5->width >> 3) * (int)store_op + local_340->static_index;
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,&base,(char (*) [7])".Store",&template_expr,
                           (char (*) [2])0x37dfb0,psVar1,(uint *)&local_338,(char (*) [3])0x37aab7,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalar_type,(char (*) [3])0x365573);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,(int)bitcast_op._M_dataplus._M_p)
                    != &bitcast_op.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(bitcast_op._M_dataplus._M_p._4_4_,
                                           (int)bitcast_op._M_dataplus._M_p));
                }
                if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
                  operator_delete(scalar_type.super_IVariant._vptr_IVariant);
                }
                uVar4 = (int)store_op + 1;
                store_op = (char *)CONCAT44(store_op._4_4_,uVar4);
              } while (uVar4 < pSVar5->columns);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < pSVar5->vecsize);
        }
      }
      Compiler::register_write((Compiler *)this,(local_340->super_IVariant).self.id);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
        operator_delete(template_expr._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base._M_dataplus._M_p != &base.field_2) {
        operator_delete(base._M_dataplus._M_p);
      }
      goto LAB_002710d2;
    }
    write_access_chain_struct(this,chain,value,composite_chain);
  }
  else {
    write_access_chain_array(this,chain,value,composite_chain);
  }
  Compiler::register_write((Compiler *)this,(chain->super_IVariant).self.id);
LAB_002710d2:
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&target_type.member_name_cache._M_h);
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &target_type.member_type_index_redirection.stack_storage) {
    free(target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &target_type.member_types.stack_storage) {
    free(target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        );
  }
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)target_type.array_size_literal.super_VectorView<bool>.ptr !=
      &target_type.array_size_literal.stack_storage) {
    free(target_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)target_type.array.super_VectorView<unsigned_int>.ptr !=
      &target_type.array.stack_storage) {
    free(target_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}